

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildFloat1Double1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *instr;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0xd4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xb2f,"(newOpcode == Js::OpCodeAsmJs::Fround_Db)",
                       "newOpcode == Js::OpCodeAsmJs::Fround_Db");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x108);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyFloat32);
  IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x108);
  instr = IR::Instr::New(InlineMathFround,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildFloat1Double1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    Assert(newOpcode == Js::OpCodeAsmJs::Fround_Db);

    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat64);
    srcOpnd->SetValueType(ValueType::Float);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
    dstOpnd->SetValueType(ValueType::Float);

    IR::Instr * instr = IR::Instr::New(Js::OpCode::InlineMathFround, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}